

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_conv.c
# Opt level: O1

IOConversionPtr
create_conversion(FFSTypeHandle_conflict src_ioformat,FMFieldList target_field_list,
                 int target_struct_size,int pointer_size,int byte_reversal,
                 FMfloat_format target_fp_format,IOconversion_type initial_conversion,
                 int target_column_major,int string_offset_size,int converted_strings,
                 FMStructDescList target_list)

{
  int iVar1;
  FMFormat_conflict p_Var2;
  IOConversionPtr *pp_Var3;
  FFSTypeHandle_conflict src_ioformat_00;
  IOConversionPtr_conflict p_Var4;
  IOconvFieldStruct *pIVar5;
  undefined4 uVar6;
  uint uVar7;
  int iVar8;
  FMdata_type FVar9;
  FMdata_type FVar10;
  int iVar11;
  IOConversionPtr conv;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  size_t sVar15;
  char *pcVar16;
  void *pvVar17;
  IOConversionPtr p_Var18;
  conv_routine p_Var19;
  IOconversion_type IVar20;
  FMFieldList p_Var21;
  FMFieldList extraout_RDX;
  FMFieldList extraout_RDX_00;
  FMFieldList extraout_RDX_01;
  FMFieldList extraout_RDX_02;
  FMFieldList extraout_RDX_03;
  FMFieldList extraout_RDX_04;
  FMFieldList extraout_RDX_05;
  FMFieldList extraout_RDX_06;
  FMFieldList extraout_RDX_07;
  FMFieldList extraout_RDX_08;
  FMFieldList extraout_RDX_09;
  FMFieldList extraout_RDX_10;
  FMFieldList extraout_RDX_11;
  FMFieldList extraout_RDX_12;
  FMFieldList extraout_RDX_13;
  FMFieldList extraout_RDX_14;
  ulong uVar22;
  long *plVar23;
  ulong uVar24;
  undefined4 uVar25;
  ulong uVar26;
  FMFieldList p_Var27;
  long lVar28;
  FMVarInfoList p_Var29;
  byte bVar30;
  bool bVar31;
  double dVar32;
  undefined4 in_stack_0000001c;
  undefined4 in_stack_fffffffffffffef8;
  FMFieldList local_f8;
  FMfloat_format local_e8;
  uint local_e4;
  void *default_val;
  long in_elements;
  int local_c8;
  int local_c4;
  IOConversionPtr *local_c0;
  FMVarInfoList local_b8;
  FMFieldList local_b0;
  int local_a8;
  FMfloat_format local_a4;
  IOconvFieldStruct *local_a0;
  FMFieldList local_98;
  long target_elements;
  FMdata_type local_84;
  size_t local_80;
  FMFieldList local_78;
  IOConversionPtr local_70;
  ulong local_68;
  FMFieldList local_60;
  FMFieldList local_58;
  long local_50;
  FFSTypeHandle *local_48;
  char *local_40;
  size_t local_38;
  
  local_80 = (size_t)target_column_major;
  local_c8 = byte_reversal;
  local_a8 = pointer_size;
  uVar7 = count_FMfield(target_field_list);
  local_60 = copy_field_list(target_field_list);
  p_Var2 = src_ioformat->body;
  local_b0 = p_Var2->field_list;
  local_b8 = p_Var2->var_list;
  local_a4 = p_Var2->float_format;
  conv = (IOConversionPtr)ffs_malloc((long)(int)uVar7 * 0x48 + 0xd8);
  p_Var21 = local_60;
  p_Var2 = src_ioformat->body;
  local_e8 = target_fp_format;
  if (target_fp_format == Format_Unknown) {
    local_e8 = ffs_my_float_format;
  }
  local_c4 = p_Var2->column_major_arrays;
  conv->notify_of_format_change = 0;
  conv->context = src_ioformat->context;
  local_48 = &conv->ioformat;
  conv->ioformat = src_ioformat;
  conv->base_size_delta = (long)target_struct_size - (long)p_Var2->record_length;
  conv->max_var_expansion = 1.0;
  conv->conv_count = 0;
  qsort(local_60,(long)(int)uVar7,0x18,field_offset_compar);
  conv->native_field_list = p_Var21;
  conv->target_pointer_size = local_a8;
  conv->required_alignment = 8;
  conv->free_data = (void *)0x0;
  conv->free_func = (_func_void_void_ptr *)0x0;
  conv->conv_pkg = (char *)0x0;
  conv->conv_func = (conv_routine)0x0;
  conv->conv_func4 = (conv_routine)0x0;
  conv->conv_func2 = (conv_routine)0x0;
  conv->conv_func1 = (conv_routine)0x0;
  conv->string_offset_size = local_80;
  conv->converted_strings = 0;
  p_Var21 = (FMFieldList)(ulong)initial_conversion;
  IVar20 = buffer_and_convert;
  if (buffer_and_convert < initial_conversion) {
    IVar20 = initial_conversion;
  }
  local_f8 = (FMFieldList)(ulong)IVar20;
  if (src_ioformat->body->record_length <= target_struct_size) {
    local_f8 = p_Var21;
  }
  local_a0 = conv->conversions;
  local_68 = (ulong)uVar7;
  local_78 = local_b0 + 1;
  local_e4 = 0;
  local_70 = conv;
LAB_0010ff81:
  iVar8 = (int)p_Var21;
  if (0 < (int)local_e4) {
    lVar28 = 0;
    do {
      *(undefined8 *)((long)&conv->conversions[0].iovar + lVar28) = 0;
      pvVar17 = *(void **)((long)&conv->conversions[0].default_value + lVar28);
      if (pvVar17 != (void *)0x0) {
        free(pvVar17);
        p_Var21 = extraout_RDX;
      }
      p_Var18 = *(IOConversionPtr *)((long)&conv->conversions[0].subconversion + lVar28);
      if (p_Var18 != (IOConversionPtr)0x0) {
        FFSfree_conversion(p_Var18);
        p_Var21 = extraout_RDX_00;
      }
      iVar8 = (int)p_Var21;
      lVar28 = lVar28 + 0x48;
    } while ((ulong)local_e4 * 0x48 != lVar28);
  }
  conv->conversion_type = (IOconversion_type)local_f8;
  if ((int)local_68 < 1) {
switchD_00110787_caseD_7:
    p_Var19 = generate_conversion(conv,src_ioformat->body->alignment,iVar8);
    conv->conv_func = p_Var19;
    switch(conv->required_alignment) {
    case 0:
    case 8:
      break;
    case 1:
      conv->conv_func1 = p_Var19;
    case 2:
      conv->conv_func2 = p_Var19;
    case 4:
      conv->conv_func4 = p_Var19;
      break;
    default:
      uVar7 = conv->required_alignment - 0x10;
      if ((uVar7 < 0x31) && ((0x1000000010001U >> ((ulong)uVar7 & 0x3f) & 1) != 0)) {
        return conv;
      }
    case 3:
    case 5:
    case 6:
    case 7:
      create_conversion_cold_1();
    }
    return conv;
  }
  uVar24 = 0;
  local_50 = 1;
  local_58 = local_78;
  local_e4 = 0;
  do {
    default_val = (void *)0x0;
    p_Var21 = local_60 + uVar24;
    pcVar16 = local_60[uVar24].field_name;
    pcVar12 = strchr(pcVar16,0x28);
    local_98 = p_Var21;
    if ((pcVar12 == (char *)0x0) || (conv->context->fmc->ignore_default_values != 0)) {
      p_Var21 = extraout_RDX_01;
      pcVar12 = (char *)0x0;
    }
    else {
      sVar15 = strlen(pcVar16);
      pcVar16 = (char *)ffs_malloc(sVar15);
      pcVar12 = base_data_type(p_Var21->field_type);
      FVar9 = FMstr_to_data_type(pcVar12);
      strncpy(pcVar16,p_Var21->field_name,0x80);
      pcVar13 = strchr(pcVar16,0x28);
      default_val = (void *)0x0;
      free(pcVar12);
      p_Var21 = extraout_RDX_02;
      pcVar12 = pcVar16;
      if (pcVar13 != (char *)0x0) {
        *pcVar13 = '\0';
        pcVar13 = pcVar13 + 1;
        pcVar14 = strchr(pcVar13,0x29);
        if (pcVar14 != (char *)0x0) {
          *pcVar14 = '\0';
        }
        p_Var21 = extraout_RDX_03;
        if (0 < (int)pcVar14 - (int)pcVar13) {
          str_to_val(pcVar13,FVar9,local_98->field_size,&default_val);
          p_Var21 = extraout_RDX_04;
        }
      }
    }
    if (uVar24 < 0xb) {
LAB_00110160:
      pcVar13 = local_b0->field_name;
      uVar26 = 0xffffffffffffffff;
      if (pcVar13 != (char *)0x0) {
        uVar22 = 0;
        p_Var27 = local_78;
        do {
          iVar8 = strcmp(pcVar16,pcVar13);
          p_Var21 = extraout_RDX_07;
          uVar26 = uVar22;
          if (iVar8 == 0) break;
          uVar22 = uVar22 + 1;
          pcVar13 = p_Var27->field_name;
          p_Var27 = p_Var27 + 1;
          uVar26 = 0xffffffffffffffff;
        } while (pcVar13 != (char *)0x0);
      }
    }
    else {
      lVar28 = local_50;
      do {
        uVar26 = (ulong)((int)lVar28 - 1);
        iVar8 = strcmp(pcVar16,local_b0[uVar26].field_name);
        p_Var21 = extraout_RDX_05;
        if (iVar8 == 0) goto LAB_0011019f;
        lVar28 = lVar28 + -1;
      } while ((long)(uVar24 - 9) < lVar28);
      uVar26 = uVar24;
      p_Var27 = local_58;
      do {
        if ((uVar24 + 9 <= uVar26) || (p_Var27->field_name == (char *)0x0)) goto LAB_00110160;
        iVar8 = strcmp(pcVar16,p_Var27->field_name);
        p_Var27 = p_Var27 + 1;
        uVar26 = uVar26 + 1;
        p_Var21 = extraout_RDX_06;
      } while (iVar8 != 0);
    }
LAB_0011019f:
    conv = local_70;
    iVar8 = (int)uVar26;
    uVar7 = (uint)local_f8;
    if (iVar8 == -1) {
      if (default_val == (void *)0x0) {
        fprintf(_stderr,"Requested field %s missing from input format\n",local_98->field_name);
        FFSfree_conversion(conv);
        uVar25 = 1;
        p_Var21 = extraout_RDX_13;
      }
      else {
        uVar25 = 7;
        if ((uVar7 & 0xfffffffe) == 2) goto LAB_0011076c;
        free(default_val);
        default_val = (void *)0x0;
        local_f8 = (FMFieldList)0x2;
        uVar25 = 3;
        p_Var21 = extraout_RDX_08;
      }
      if (pcVar12 != (char *)0x0) {
        free(pcVar12);
        p_Var21 = extraout_RDX_09;
      }
    }
    else {
      if (pcVar12 != (char *)0x0) {
        free(pcVar12);
      }
      if (default_val != (void *)0x0) {
        free(default_val);
        default_val = (void *)0x0;
      }
      local_40 = local_b0[iVar8].field_name;
      pp_Var3 = (IOConversionPtr *)local_b0[iVar8].field_type;
      iVar1 = local_b0[iVar8].field_size;
      local_38 = (size_t)local_b0[iVar8].field_offset;
      FVar9 = FMarray_str_to_data_type((char *)pp_Var3,&in_elements);
      lVar28 = in_elements;
      local_c0 = pp_Var3;
      if (in_elements == 1) {
LAB_001102cf:
        bVar30 = false;
      }
      else {
        sVar15 = strlen((char *)pp_Var3);
        pcVar16 = (char *)memchr(pp_Var3,0x5b,sVar15);
        if (pcVar16 == (char *)0x0) goto LAB_001102cf;
        sVar15 = strlen(pcVar16);
        pvVar17 = memchr(pcVar16 + 1,0x5b,sVar15);
        bVar30 = pvVar17 != (void *)0x0;
      }
      p_Var27 = local_98;
      if (lVar28 == -1) {
        in_elements = 1;
      }
      FVar10 = FMarray_str_to_data_type(local_98->field_type,&target_elements);
      if (target_elements == -1) {
        target_elements = 1;
      }
      p_Var21 = extraout_RDX_10;
      if (uVar7 < 2) {
        if (p_Var27->field_offset == local_b0[iVar8].field_offset) {
          if (in_elements == target_elements) {
            if ((((local_c8 == 0) && (FVar9 != unknown_type)) && (FVar9 == FVar10)) &&
               (FVar9 != float_type || local_e8 == local_a4)) {
              bVar31 = local_c4 != 0;
              local_84 = FVar10;
              iVar11 = field_is_flat(src_ioformat->body,&local_b8[iVar8].type_desc);
              p_Var21 = extraout_RDX_11;
              FVar10 = local_84;
              if (((iVar11 != 0) && ((bVar31 & bVar30) == 0)) && (p_Var27->field_size == iVar1)) {
                uVar25 = 9;
                goto LAB_0011076c;
              }
            }
          }
          if ((in_elements == 1) || (p_Var27->field_size == iVar1)) {
            if ((bVar30 & local_c4 != 0) == 0) {
              if (((FVar9 != unknown_type) || (local_b8[iVar8].var_array != 0)) ||
                 (local_b8[iVar8].type_desc.type == FMType_pointer)) goto LAB_00110427;
              bVar31 = true;
              uVar25 = 0;
              if ((src_ioformat->field_subformats[iVar8] != (FFSTypeHandle_conflict)0x0) &&
                 (p_Var4 = src_ioformat->field_subformats[iVar8]->conversion, uVar25 = 0,
                 p_Var4 != (IOConversionPtr_conflict)0x0)) {
                IVar20 = p_Var4->conversion_type;
                if (IVar20 == none_required) {
                  uVar25 = 9;
                  bVar31 = false;
                }
                else {
                  if (IVar20 == buffer_and_convert) {
                    bVar31 = false;
                    uVar6 = 3;
                  }
                  else {
                    uVar25 = 0;
                    uVar6 = 0;
                    if (IVar20 != direct_to_mem) goto LAB_0011084d;
                  }
                  uVar25 = uVar6;
                  local_f8 = (FMFieldList)(ulong)IVar20;
                }
              }
LAB_0011084d:
              if (!bVar31) goto LAB_0011076c;
              goto LAB_00110427;
            }
            goto LAB_00110448;
          }
        }
        local_f8 = (FMFieldList)0x2;
LAB_00110454:
        uVar25 = 3;
      }
      else {
        if (uVar7 == 2) {
LAB_00110427:
          if (((local_b8[iVar8].var_array != 0) ||
              (local_b8[iVar8].type_desc.type == FMType_pointer)) && (p_Var27->field_size != iVar1))
          {
LAB_00110448:
            local_f8 = (FMFieldList)0x3;
            goto LAB_00110454;
          }
LAB_00110467:
          if ((local_b8[iVar8].var_array != 0) || (local_b8[iVar8].type_desc.type == FMType_pointer)
             ) {
            uVar7 = p_Var27->field_size - 1;
            iVar11 = 8;
            if (uVar7 < 7) {
              iVar11 = *(int *)(&DAT_0013a420 + (ulong)uVar7 * 4);
            }
            dVar32 = (double)(iVar11 + p_Var27->field_size) / (double)iVar1;
            if (conv->max_var_expansion <= dVar32 && dVar32 != conv->max_var_expansion) {
              conv->max_var_expansion = dVar32;
            }
          }
        }
        else if (uVar7 == 3) goto LAB_00110467;
        if ((in_elements == target_elements) && (FVar9 == FVar10)) {
          IVar20 = (int)local_f8 + (uint)((int)local_f8 == 0);
          local_f8 = (FMFieldList)(ulong)IVar20;
          conv->conversion_type = IVar20;
          lVar28 = (long)(int)local_e4;
          pIVar5 = local_a0 + lVar28;
          (pIVar5->src_field).byte_swap = '\0';
          (pIVar5->src_field).src_float_format = '\0';
          (pIVar5->src_field).target_float_format = '\0';
          *(undefined5 *)&(pIVar5->src_field).field_0x13 = 0;
          *(undefined8 *)(&(pIVar5->src_field).byte_swap + 8) = 0;
          pIVar5 = local_a0 + lVar28;
          (pIVar5->src_field).offset = 0;
          (pIVar5->src_field).size = 0;
          (pIVar5->src_field).data_type = unknown_type;
          local_a0[lVar28].src_field.byte_swap = (uchar)local_c8;
          local_a0[lVar28].src_field.src_float_format = (uchar)local_a4;
          local_a0[lVar28].src_field.target_float_format = (uchar)local_e8;
          local_a0[lVar28].subconversion = (IOConversionPtr)0x0;
          local_a0[lVar28].rc_swap = no_row_column_swap;
          if (bVar30 == 1 && local_c4 != 0) {
            local_a0[lVar28].rc_swap =
                 (src_ioformat->body->column_major_arrays == 0) + swap_source_column_major;
          }
          pIVar5 = local_a0 + lVar28;
          FVar9 = FMarray_str_to_data_type((char *)local_c0,&in_elements);
          p_Var29 = local_b8 + iVar8;
          pIVar5->iovar = p_Var29;
          if (FVar9 == unknown_type) {
            src_ioformat_00 = src_ioformat->field_subformats[iVar8];
            if (src_ioformat_00 == (FFSTypeHandle_conflict)0x0) {
              fprintf(_stderr,"Unknown field type for field %s ->\"%s\", format %p\n",local_40,
                      src_ioformat->body->field_list[iVar8].field_type);
              FFSfree_conversion(conv);
LAB_00110673:
              p_Var21 = (FMFieldList)(ulong)FVar9;
            }
            else {
              pcVar12 = base_data_type((char *)local_c0);
              plVar23 = (long *)CONCAT44(in_stack_0000001c,string_offset_size);
              pcVar16 = (char *)*plVar23;
              while ((pcVar16 != (char *)0x0 && (iVar8 = strcmp(pcVar12,pcVar16), iVar8 != 0))) {
                pcVar16 = (char *)plVar23[4];
                plVar23 = plVar23 + 4;
              }
              local_c0 = &local_a0[lVar28].subconversion;
              iVar8 = 0x11060c;
              free(pcVar12);
              if (src_ioformat_00 == src_ioformat) {
                *local_c0 = conv;
                p_Var21 = (FMFieldList)(ulong)FVar9;
              }
              else {
                p_Var21 = (FMFieldList)(ulong)FVar9;
                if (*plVar23 != 0) {
                  p_Var18 = create_conversion(src_ioformat_00,(FMFieldList)plVar23[1],
                                              (int)plVar23[2],local_a8,local_c8,local_e8,IVar20,
                                              (int)local_80,string_offset_size,iVar8,
                                              (FMStructDescList)
                                              CONCAT44(FVar9,in_stack_fffffffffffffef8));
                  pp_Var3 = local_c0;
                  if (*local_c0 != (IOConversionPtr)0x0) {
                    puts("Subconversion already had value!");
                  }
                  *pp_Var3 = p_Var18;
                  goto LAB_00110673;
                }
              }
            }
            FVar9 = (FMdata_type)p_Var21;
            if (src_ioformat_00 == (FFSTypeHandle_conflict)0x0) goto LAB_00110766;
          }
          if (p_Var29->var_array != 0) {
            in_elements = 1;
          }
          pIVar5 = local_a0 + lVar28;
          (pIVar5->src_field).data_type = FVar9;
          (pIVar5->src_field).offset = local_38;
          (pIVar5->src_field).size = iVar1;
          pIVar5->dest_size = local_98->field_size;
          pIVar5->dest_offset = (long)local_98->field_offset;
          pIVar5->default_value = (void *)0x0;
          local_e4 = local_e4 + 1;
          conv->conv_count = local_e4;
          uVar25 = 0;
          p_Var21 = local_98;
          if (default_val != (void *)0x0) {
            free(default_val);
            default_val = (void *)0x0;
            p_Var21 = extraout_RDX_12;
          }
        }
        else {
          fprintf(_stderr,"Requested field %s base type %s \n   differs from source type %s\n\n",
                  p_Var27->field_name,p_Var27->field_type,local_c0);
          FFSfree_conversion(conv);
          p_Var21 = extraout_RDX_14;
LAB_00110766:
          uVar25 = 1;
        }
      }
    }
LAB_0011076c:
    iVar8 = (int)p_Var21;
    switch(uVar25) {
    case 0:
    case 9:
      uVar24 = uVar24 + 1;
      local_50 = local_50 + 1;
      local_58 = local_58 + 1;
      if (uVar24 == local_68) goto switchD_00110787_caseD_7;
      break;
    default:
      return (IOConversionPtr)0x0;
    case 3:
      goto switchD_00110787_caseD_3;
    case 7:
      goto switchD_00110787_caseD_7;
    }
  } while( true );
switchD_00110787_caseD_3:
  goto LAB_0010ff81;
}

Assistant:

static
IOConversionPtr
create_conversion(FFSTypeHandle src_ioformat, FMFieldList target_field_list, int target_struct_size, int pointer_size,
		  int byte_reversal, FMfloat_format target_fp_format, IOconversion_type initial_conversion,
		  int target_column_major, int string_offset_size, int converted_strings, FMStructDescList target_list)
{
    int target_field_count = count_FMfield(target_field_list);
    FMFieldList nfl_sort = copy_field_list(target_field_list);
    FMFieldList input_field_list = src_ioformat->body->field_list;
    FMVarInfoList input_var_list = src_ioformat->body->var_list;
    IOconversion_type conv = initial_conversion;
    int input_index, conv_index = 0, i = 0;
    FMfloat_format src_float_format = src_ioformat->body->float_format;
    IOConversionPtr conv_ptr =
	(IOConversionPtr) malloc(sizeof(IOConversionStruct) +
				 target_field_count * sizeof(IOconvFieldStruct));
    int column_row_swap_necessary = (target_column_major != src_ioformat->body->column_major_arrays);
    
    if (target_fp_format == Format_Unknown) target_fp_format = ffs_my_float_format;

    conv_ptr->notify_of_format_change = 0;
    conv_ptr->context = src_ioformat->context;
    conv_ptr->ioformat = src_ioformat;
    conv_ptr->base_size_delta = target_struct_size -
	src_ioformat->body->record_length;
    conv_ptr->max_var_expansion = 1.0;
    conv_ptr->conv_count = 0;
    qsort(nfl_sort, target_field_count, sizeof(nfl_sort[0]),
	  field_offset_compar);
    conv_ptr->native_field_list = nfl_sort;
    conv_ptr->target_pointer_size = pointer_size;
    conv_ptr->required_alignment = 8; /* placeholder */
    conv_ptr->free_data = NULL;
    conv_ptr->free_func = NULL;
    conv_ptr->conv_func = NULL;
    conv_ptr->conv_func4 = NULL;
    conv_ptr->conv_func2 = NULL;
    conv_ptr->conv_func1 = NULL;
    conv_ptr->conv_pkg = NULL;
    conv_ptr->string_offset_size = string_offset_size;
    conv_ptr->converted_strings = converted_strings;

    /* 
     * We assume that the fields listed in the target_field_list are
     * those that the user is interested in.  Skipping input fields
     * is OK... 
     */

    if (src_ioformat->body->record_length > target_struct_size) {
	/* if input record is larger than target record, must do buffered */
	switch (conv) {
	case none_required:
	case direct_to_mem:
	    conv = buffer_and_convert;
	    break;
	case buffer_and_convert:
	case copy_dynamic_portion:
	    break;
	default:
	    assert(FALSE);
	}
    }
    /* try for no conversion/direct_to_memory first.. */
  restart:
    if (conv_index > 0) {
	/* really a restart, NULL a couple of things */
	int i = 0;
	for (i=0; i < conv_index; i++) {
	    conv_ptr->conversions[i].iovar = NULL;
	    if (conv_ptr->conversions[i].default_value) {
		free(conv_ptr->conversions[i].default_value);
	    }
	    if (conv_ptr->conversions[i].subconversion) {
		FFSfree_conversion(conv_ptr->conversions[i].subconversion);
	    }
	}
    }
    conv_ptr->conversion_type = conv;
    input_index = conv_index = 0;
    for (i = 0; i < target_field_count; i++) {
	FMField input_field;
	FMdata_type in_data_type, target_data_type;
	long in_elements, target_elements;
	void *default_val = NULL;
	char *tmp_field_name = NULL;
	char *search_name;
	int multi_dimen_array = 0;

	/* 
	 * all fields in the target list must appear at the same offset
	 * as in the input list.
	 */
	input_index = 0;
	
	if ((strchr(nfl_sort[i].field_name, '(') == NULL) || conv_ptr->context->fmc->ignore_default_values) {
	    /* no default value */
	    search_name = (char *) nfl_sort[i].field_name;
	} else {
	    tmp_field_name = malloc(strlen(nfl_sort[i].field_name)); /* certainly big enough */
	    field_name_strip_get_default(&nfl_sort[i], tmp_field_name, &default_val);
	    search_name = tmp_field_name;
	}
	input_index = find_field_for_conv(search_name, input_field_list, i, NULL);
	if (input_index == -1) {
	    if(default_val){
	        if ((conv == buffer_and_convert) || 
		    (conv == copy_dynamic_portion)) {
		    input_index = -1; /* Basically invalidating input_index
				   Indication for using default_val */
		    break;
		} else {
		    if (default_val) {
		        free(default_val);
			default_val = NULL;
		    }
		    conv = buffer_and_convert;
		    if (tmp_field_name) free(tmp_field_name);
		    goto restart;
		}
	    }
	    fprintf(stderr,
		    "Requested field %s missing from input format\n",
		    nfl_sort[i].field_name);
	    FFSfree_conversion(conv_ptr);
	    if (tmp_field_name) free(tmp_field_name);
	    return NULL;
	}
	if (tmp_field_name) free(tmp_field_name);
	if(input_index == -1){
	    create_default_conversion(nfl_sort[i], default_val, &conv_ptr, 
				      conv_index);
	    conv_ptr->conversion_type = conv;
	    conv_ptr->conv_count = ++conv_index;
	    continue;
	} else {
	    if (default_val) {
		free(default_val);
		default_val = NULL;
	    }
	}
	input_field = input_field_list[input_index];
	in_data_type = FMarray_str_to_data_type(input_field.field_type,
					      &in_elements);
	if (in_elements != 1) {
	    char *first_bracket = memchr(input_field.field_type, '[', strlen(input_field.field_type));
	    if (first_bracket != NULL) {
		char *sec_bracket = memchr(first_bracket+1, '[', strlen(first_bracket));
		if (sec_bracket) multi_dimen_array++;
	    }
	}
	    
	if (in_elements == -1) {
	    in_elements = 1;	/* var array */
	}
	target_data_type = FMarray_str_to_data_type(nfl_sort[i].field_type,
						  &target_elements);
	if (target_elements == -1) {
	    target_elements = 1;	/* var array */
	}
	switch (conv) {
	case none_required:
	case direct_to_mem:
	    if (nfl_sort[i].field_offset !=
		input_field_list[input_index].field_offset) {

		/* 
		 * we were planning direct to memory transfer, but found a 
		 * field that we couldn't do that way.   start over
		 * planning buffer and convert. 
		 */
		conv = buffer_and_convert;
		goto restart;
	    }
	    if ((in_elements == target_elements) &&
		(in_data_type == target_data_type) &&
		(in_data_type != unknown_type) &&
		(!byte_reversal) &&
		((in_data_type != float_type) ||
		 (target_fp_format == src_float_format)) &&
		field_is_flat(src_ioformat->body, 
			      &input_var_list[input_index].type_desc) &&
		(!column_row_swap_necessary || !multi_dimen_array) &&
		(nfl_sort[i].field_size == input_field.field_size)) {
		/* nothing to do for this field */
		continue;
	    }
	    if ((in_elements != 1) &&
		(nfl_sort[i].field_size != input_field.field_size)) {
		/* Can't do direct to memory with array field interleaving 
		 * 
		 */
		conv = buffer_and_convert;
		goto restart;
	    }
	    if (column_row_swap_necessary && multi_dimen_array) {
		/* Can't transpose an array in place
		 * 
		 */
		conv = copy_dynamic_portion;
		goto restart;
	    }

	    if ((in_data_type == unknown_type) && 
		!input_var_list[input_index].var_array &&
		(input_var_list[input_index].type_desc.type != FMType_pointer)) {
		FFSTypeHandle format = src_ioformat->field_subformats[input_index];
		if ((format != NULL) && (format->conversion != NULL)) {
		    switch (format->conversion->conversion_type) {
		    case copy_dynamic_portion:
			assert(conv == copy_dynamic_portion);
			break;
		    case buffer_and_convert:
			conv = buffer_and_convert;
			goto restart;
		    case direct_to_mem:
			conv = direct_to_mem;
			break;
		    case none_required:
			continue;
		    }
		}
	    }
	    /* falling through */
	case buffer_and_convert:
	    if (input_var_list[input_index].var_array ||
	    	(input_var_list[input_index].type_desc.type == FMType_pointer)) {
	    	if (nfl_sort[i].field_size != input_field.field_size) {
	    	    /* argh.  Must buffer variant part too */
	    	    conv = copy_dynamic_portion;
	    	    goto restart;
	    	}
	    }
	case copy_dynamic_portion:
	    if (input_var_list[input_index].var_array ||
		(input_var_list[input_index].type_desc.type == FMType_pointer)) {
		/* 
		 * expansion value includes padding for possibly having
		 * to re-align the value to the proper boundary.
		 * (This is generally a gross overestimate, but it's safe.)
		 */
		int local_size = nfl_sort[i].field_size +
		min_align_size(nfl_sort[i].field_size);
		double expansion = ((double) local_size) / input_field.field_size;
		if (expansion > conv_ptr->max_var_expansion) {
		    conv_ptr->max_var_expansion = expansion;
		}
	    }
	    break;
	default:
	    assert(FALSE);
	}
	if ((in_elements != target_elements) || 
	    (in_data_type != target_data_type)) {

	    fprintf(stderr,
		    "Requested field %s base type %s \n   differs from source type %s\n\n",
		    nfl_sort[i].field_name, nfl_sort[i].field_type,
		    input_field.field_type);
	    FFSfree_conversion(conv_ptr);
	    return NULL;
	}
	if (conv == none_required) {
	    conv = direct_to_mem;
	}
	conv_ptr->conversion_type = conv;
	memset(&conv_ptr->conversions[conv_index].src_field, 0, 
	       sizeof(conv_ptr->conversions[conv_index].src_field));
	conv_ptr->conversions[conv_index].src_field.byte_swap = byte_reversal;
	conv_ptr->conversions[conv_index].src_field.src_float_format =
	    src_float_format;
	conv_ptr->conversions[conv_index].src_field.target_float_format =
	    target_fp_format;
	conv_ptr->conversions[conv_index].subconversion = NULL;
	conv_ptr->conversions[conv_index].iovar = NULL;
	conv_ptr->conversions[conv_index].rc_swap = no_row_column_swap;
	if (column_row_swap_necessary & multi_dimen_array) {
	    if (src_ioformat->body->column_major_arrays) {
		conv_ptr->conversions[conv_index].rc_swap = swap_source_column_major;
	    } else {
		conv_ptr->conversions[conv_index].rc_swap = swap_source_row_major;
	    }
	}
	in_data_type = FMarray_str_to_data_type(input_field.field_type, 
					      &in_elements);
	conv_ptr->conversions[conv_index].iovar =
	    &input_var_list[input_index];
	if (in_data_type == unknown_type) {
	    FFSTypeHandle format = src_ioformat->field_subformats[input_index];
	    if (format != NULL) {
		int format_index = 0;
		char *base_type = base_data_type(input_field.field_type);

		while(target_list[format_index].format_name && 
		      (strcmp(base_type, target_list[format_index].format_name) != 0)) {
		    format_index++;
		}
		free(base_type);
	        if (format == src_ioformat) {
		    conv_ptr->conversions[conv_index].subconversion = conv_ptr;
		} else if (target_list[format_index].format_name != NULL) {
		    IOConversionPtr subconv;
		    int target_struct_size = target_list[format_index].struct_size;
		    subconv =
		      create_conversion(format,
					target_list[format_index].field_list,
					target_struct_size, pointer_size,
					byte_reversal, target_fp_format,
					conv, target_column_major,
					string_offset_size,
					converted_strings, target_list);
		    if (conv_ptr->conversions[conv_index].subconversion) {
			printf("Subconversion already had value!\n");
		    }
		    conv_ptr->conversions[conv_index].subconversion = subconv;
		}
	    } else {
		
		fprintf(stderr, "Unknown field type for field %s ->\"%s\", format %p\n",
			input_field.field_name,
			src_ioformat->body->field_list[input_index].field_type,
			src_ioformat);
		FFSfree_conversion(conv_ptr);
		return NULL;
	    }
	}
	if (input_var_list[input_index].var_array) {
	    in_elements = 1;
	}
	conv_ptr->conversions[conv_index].src_field.data_type = in_data_type;
	conv_ptr->conversions[conv_index].src_field.offset =
	    input_field.field_offset;
	conv_ptr->conversions[conv_index].src_field.size =
	    input_field.field_size;
	conv_ptr->conversions[conv_index].dest_size =
	    nfl_sort[i].field_size;
	conv_ptr->conversions[conv_index].dest_offset =
	    nfl_sort[i].field_offset;
	conv_ptr->conversions[conv_index].default_value = NULL;
	conv_ptr->conv_count = ++conv_index;
	if (default_val) {
	    free(default_val);
	    default_val = NULL;
	}
    }
    conv_ptr->conv_func = generate_conversion(conv_ptr, src_ioformat->body->alignment, 4);
    switch(conv_ptr->required_alignment) {
    case 1:
	conv_ptr->conv_func1 = conv_ptr->conv_func;
	/* falling */
    case 2:
	conv_ptr->conv_func2 = conv_ptr->conv_func;
	/* falling */
    case 4:
	conv_ptr->conv_func4 = conv_ptr->conv_func;
	/* falling */
    case 8:
    case 16:
    case 32:
    case 64:
	/* really can't imagine these currently, but... */
    case 0:
	/* zero is no conversion, so no requirement */
	break;
    default:
	fprintf(stderr, "Funky alignment, %d, for conversion %s\n",
		conv_ptr->required_alignment, 
		conv_ptr->ioformat->body->format_name);
    }
    return conv_ptr;
}